

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LoopLayerParams::MergeFrom(LoopLayerParams *this,LoopLayerParams *from)

{
  void *pvVar1;
  ArenaStringPtr value;
  LogMessage *other;
  NeuralNetwork *pNVar2;
  NeuralNetwork *pNVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x575b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  value.ptr_ = (from->conditionvar_).ptr_;
  if ((value.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->conditionvar_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  }
  if ((from != (LoopLayerParams *)&_LoopLayerParams_default_instance_) &&
     (from->conditionnetwork_ != (NeuralNetwork *)0x0)) {
    pNVar2 = mutable_conditionnetwork(this);
    pNVar3 = from->conditionnetwork_;
    if (pNVar3 == (NeuralNetwork *)0x0) {
      pNVar3 = (NeuralNetwork *)&_NeuralNetwork_default_instance_;
    }
    NeuralNetwork::MergeFrom(pNVar2,pNVar3);
  }
  if ((from != (LoopLayerParams *)&_LoopLayerParams_default_instance_) &&
     (from->bodynetwork_ != (NeuralNetwork *)0x0)) {
    pNVar2 = mutable_bodynetwork(this);
    pNVar3 = from->bodynetwork_;
    if (pNVar3 == (NeuralNetwork *)0x0) {
      pNVar3 = (NeuralNetwork *)&_NeuralNetwork_default_instance_;
    }
    NeuralNetwork::MergeFrom(pNVar2,pNVar3);
  }
  if (from->maxloopiterations_ != 0) {
    this->maxloopiterations_ = from->maxloopiterations_;
  }
  return;
}

Assistant:

void LoopLayerParams::MergeFrom(const LoopLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LoopLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.conditionvar().size() > 0) {

    conditionvar_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.conditionvar_);
  }
  if (from.has_conditionnetwork()) {
    mutable_conditionnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.conditionnetwork());
  }
  if (from.has_bodynetwork()) {
    mutable_bodynetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.bodynetwork());
  }
  if (from.maxloopiterations() != 0) {
    set_maxloopiterations(from.maxloopiterations());
  }
}